

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

void __thiscall
testing::internal::TypedExpectation<void_(gurkenlaeufer::Scenario)>::TypedExpectation
          (TypedExpectation<void_(gurkenlaeufer::Scenario)> *this,
          FunctionMockerBase<void_(gurkenlaeufer::Scenario)> *owner,char *a_file,int a_line,
          string *a_source_text,ArgumentMatcherTuple *m)

{
  ArgumentMatcherTuple *m_local;
  string *a_source_text_local;
  int a_line_local;
  char *a_file_local;
  FunctionMockerBase<void_(gurkenlaeufer::Scenario)> *owner_local;
  TypedExpectation<void_(gurkenlaeufer::Scenario)> *this_local;
  
  ExpectationBase::ExpectationBase(&this->super_ExpectationBase,a_file,a_line,a_source_text);
  (this->super_ExpectationBase)._vptr_ExpectationBase =
       (_func_int **)&PTR__TypedExpectation_00206c20;
  this->owner_ = owner;
  std::tuple<testing::Matcher<gurkenlaeufer::Scenario>_>::tuple(&this->matchers_,m);
  A<std::tuple<gurkenlaeufer::Scenario>const&>();
  DoDefault();
  DoDefaultAction::operator_cast_to_Action((DoDefaultAction *)&this->repeated_action_);
  return;
}

Assistant:

TypedExpectation(FunctionMockerBase<F>* owner,
                   const char* a_file, int a_line, const string& a_source_text,
                   const ArgumentMatcherTuple& m)
      : ExpectationBase(a_file, a_line, a_source_text),
        owner_(owner),
        matchers_(m),
        // By default, extra_matcher_ should match anything.  However,
        // we cannot initialize it with _ as that triggers a compiler
        // bug in Symbian's C++ compiler (cannot decide between two
        // overloaded constructors of Matcher<const ArgumentTuple&>).
        extra_matcher_(A<const ArgumentTuple&>()),
        repeated_action_(DoDefault()) {}